

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_symlink(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  char *ptr;
  char *__to;
  int *piVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  JVar3.float64 = 0.0;
  ptr = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  iVar4 = 6;
  if (ptr != (char *)0x0) {
    __to = JS_ToCStringLen2(ctx,(size_t *)0x0,argv[1],0);
    if (__to == (char *)0x0) {
      JS_FreeCString(ctx,ptr);
      JVar3.float64 = 0.0;
    }
    else {
      uVar1 = symlink(ptr,__to);
      if (uVar1 == 0xffffffff) {
        piVar2 = __errno_location();
        uVar1 = -*piVar2;
      }
      JS_FreeCString(ctx,ptr);
      JS_FreeCString(ctx,__to);
      JVar3._4_4_ = 0;
      JVar3.int32 = uVar1;
      iVar4 = 0;
    }
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_symlink(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *target, *linkpath;
    int err;
    
    target = JS_ToCString(ctx, argv[0]);
    if (!target)
        return JS_EXCEPTION;
    linkpath = JS_ToCString(ctx, argv[1]);
    if (!linkpath) {
        JS_FreeCString(ctx, target);
        return JS_EXCEPTION;
    }
    err = js_get_errno(symlink(target, linkpath));
    JS_FreeCString(ctx, target);
    JS_FreeCString(ctx, linkpath);
    return JS_NewInt32(ctx, err);
}